

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiveProxy.cpp
# Opt level: O0

bool __thiscall
aeron::archive::ArchiveProxy::listRecording
          (ArchiveProxy *this,int64_t recordingId,int64_t correlationId,int64_t controlSessionId)

{
  bool bVar1;
  ListRecordingRequest *pLVar2;
  uint64_t uVar3;
  undefined1 local_60 [8];
  ListRecordingRequest msg;
  int64_t controlSessionId_local;
  int64_t correlationId_local;
  int64_t recordingId_local;
  ArchiveProxy *this_local;
  
  msg.m_actingVersion = controlSessionId;
  io::aeron::archive::codecs::ListRecordingRequest::ListRecordingRequest
            ((ListRecordingRequest *)local_60);
  pLVar2 = wrapAndApplyHeader<io::aeron::archive::codecs::ListRecordingRequest>
                     (this,(ListRecordingRequest *)local_60);
  pLVar2 = io::aeron::archive::codecs::ListRecordingRequest::controlSessionId
                     (pLVar2,msg.m_actingVersion);
  pLVar2 = io::aeron::archive::codecs::ListRecordingRequest::correlationId(pLVar2,correlationId);
  io::aeron::archive::codecs::ListRecordingRequest::recordingId(pLVar2,recordingId);
  uVar3 = io::aeron::archive::codecs::ListRecordingRequest::encodedLength
                    ((ListRecordingRequest *)local_60);
  bVar1 = offer(this,(int32_t)uVar3);
  return bVar1;
}

Assistant:

bool ArchiveProxy::listRecording(std::int64_t recordingId, std::int64_t correlationId, std::int64_t controlSessionId) {
    codecs::ListRecordingRequest msg;

    wrapAndApplyHeader(msg).controlSessionId(controlSessionId).correlationId(correlationId).recordingId(recordingId);

    return offer(msg.encodedLength());
}